

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void ChooseDistanceParams(BrotliEncoderParams *params)

{
  uint32_t local_18;
  uint32_t ndirect_msb;
  uint32_t num_direct_distance_codes;
  uint32_t distance_postfix_bits;
  BrotliEncoderParams *params_local;
  
  ndirect_msb = 0;
  local_18 = 0;
  if (3 < params->quality) {
    if (params->mode == BROTLI_MODE_FONT) {
      ndirect_msb = 1;
      local_18 = 0xc;
    }
    else {
      ndirect_msb = (params->dist).distance_postfix_bits;
      local_18 = (params->dist).num_direct_distance_codes;
    }
    if (((3 < ndirect_msb) || (0x78 < local_18)) ||
       ((local_18 >> ((byte)ndirect_msb & 0x1f) & 0xf) << ((byte)ndirect_msb & 0x1f) != local_18)) {
      ndirect_msb = 0;
      local_18 = 0;
    }
  }
  BrotliInitDistanceParams(params,ndirect_msb,local_18);
  return;
}

Assistant:

static void ChooseDistanceParams(BrotliEncoderParams* params) {
  uint32_t distance_postfix_bits = 0;
  uint32_t num_direct_distance_codes = 0;

  if (params->quality >= MIN_QUALITY_FOR_NONZERO_DISTANCE_PARAMS) {
    uint32_t ndirect_msb;
    if (params->mode == BROTLI_MODE_FONT) {
      distance_postfix_bits = 1;
      num_direct_distance_codes = 12;
    } else {
      distance_postfix_bits = params->dist.distance_postfix_bits;
      num_direct_distance_codes = params->dist.num_direct_distance_codes;
    }
    ndirect_msb = (num_direct_distance_codes >> distance_postfix_bits) & 0x0F;
    if (distance_postfix_bits > BROTLI_MAX_NPOSTFIX ||
        num_direct_distance_codes > BROTLI_MAX_NDIRECT ||
        (ndirect_msb << distance_postfix_bits) != num_direct_distance_codes) {
      distance_postfix_bits = 0;
      num_direct_distance_codes = 0;
    }
  }

  BrotliInitDistanceParams(
      params, distance_postfix_bits, num_direct_distance_codes);
}